

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client_link.cpp
# Opt level: O0

void __thiscall
miniros::ServiceClientLink::onRequest
          (ServiceClientLink *this,ConnectionPtr *conn,shared_ptr<unsigned_char[]> *buffer,
          uint32_t size,bool success)

{
  bool bVar1;
  element_type *this_00;
  undefined4 in_ECX;
  shared_ptr<unsigned_char[]> *in_RDX;
  ServicePublication *in_RSI;
  weak_ptr<miniros::ServicePublication> *in_RDI;
  undefined1 in_R8B;
  ServicePublicationPtr parent;
  shared_ptr<unsigned_char[]> *in_stack_ffffffffffffff90;
  __shared_ptr local_30 [8];
  ServiceClientLinkPtr *in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar2;
  
  uVar2 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0) & 0x1ffffff;
  if ((char)(uVar2 >> 0x18) != '\0') {
    std::weak_ptr<miniros::ServicePublication>::lock(in_RDI);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_30);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x4a7376);
      std::shared_ptr<unsigned_char[]>::shared_ptr
                (in_stack_ffffffffffffff90,(shared_ptr<unsigned_char[]> *)this_00);
      std::enable_shared_from_this<miniros::ServiceClientLink>::shared_from_this
                ((enable_shared_from_this<miniros::ServiceClientLink> *)this_00);
      ServicePublication::processRequest
                (in_RSI,in_RDX,CONCAT44(in_ECX,uVar2),in_stack_ffffffffffffffd8);
      std::shared_ptr<miniros::ServiceClientLink>::~shared_ptr
                ((shared_ptr<miniros::ServiceClientLink> *)0x4a73cb);
      std::shared_ptr<unsigned_char[]>::~shared_ptr((shared_ptr<unsigned_char[]> *)0x4a73d5);
    }
    std::shared_ptr<miniros::ServicePublication>::~shared_ptr
              ((shared_ptr<miniros::ServicePublication> *)0x4a7421);
  }
  return;
}

Assistant:

void ServiceClientLink::onRequest(const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
{
  (void)conn;
  if (!success)
    return;

  MINIROS_ASSERT(conn == connection_);

  if (ServicePublicationPtr parent = parent_.lock())
  {
    parent->processRequest(buffer, size, shared_from_this());
  }
  else
  {
    MINIROS_BREAK();
  }
}